

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_conn_cf_discard_chain(Curl_cfilter **pcf,Curl_easy *data)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter *local_28;
  Curl_cfilter *cf;
  Curl_cfilter *cfn;
  Curl_easy *data_local;
  Curl_cfilter **pcf_local;
  
  local_28 = *pcf;
  if (local_28 != (Curl_cfilter *)0x0) {
    *pcf = (Curl_cfilter *)0x0;
    while (local_28 != (Curl_cfilter *)0x0) {
      pCVar1 = local_28->next;
      local_28->next = (Curl_cfilter *)0x0;
      (*(code *)local_28->cft->destroy)(local_28,data);
      (*Curl_cfree)(local_28);
      local_28 = pCVar1;
    }
  }
  return;
}

Assistant:

void Curl_conn_cf_discard_chain(struct Curl_cfilter **pcf,
                                struct Curl_easy *data)
{
  struct Curl_cfilter *cfn, *cf = *pcf;

  if(cf) {
    *pcf = NULL;
    while(cf) {
      cfn = cf->next;
      /* prevent destroying filter to mess with its sub-chain, since
       * we have the reference now and will call destroy on it.
       */
      cf->next = NULL;
      cf->cft->destroy(cf, data);
      free(cf);
      cf = cfn;
    }
  }
}